

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O2

_Bool borg_caution_phase(wchar_t emergency,wchar_t turns)

{
  loc_conflict grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  int iVar7;
  loc_conflict grid2;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  wchar_t unaff_EBP;
  char *pcVar11;
  wchar_t unaff_R14D;
  wchar_t local_50;
  borg_grid *local_48;
  
  bVar10 = false;
  if (borg.trait[0xd2] != 0) {
    local_48 = borg_grids[borg.c.y] + borg.c.x;
    local_50 = L'\0';
    for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
      for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
        do {
          iVar2 = borg.c.y;
          uVar4 = Rand_div(0x15);
          iVar1 = borg.c.x;
          unaff_R14D = uVar4 + iVar2 + L'\xfffffff6';
          uVar5 = Rand_div(0x15);
          unaff_EBP = uVar5 + iVar1 + L'\xfffffff6';
          grid2 = loc(unaff_EBP,unaff_R14D);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar6 = distance(grid1,grid2);
        } while (5 < (uint)(wVar6 + L'\xfffffffb'));
        if ((((0xffffff3b < (uVar5 + iVar1) - 0xcf && 0xffffffbf < (uVar4 + iVar2) - 0x4b) &&
             (local_48 = borg_grids[(uint)unaff_R14D] + (uint)unaff_EBP,
             borg_grids[(uint)unaff_R14D][(uint)unaff_EBP].feat != '\0')) &&
            (_Var3 = borg_cave_floor_bold(unaff_R14D,unaff_EBP), _Var3)) &&
           ((local_48->kill == '\0' && (local_48->web != true)))) break;
      }
      if (local_48->feat == '\0') {
        uVar8 = 1;
        if (uVar9 < 100 && 0x1d < borg.trait[0x1c]) goto LAB_001f67cf;
      }
      else {
        uVar8 = 1;
        if (uVar9 < 100) {
LAB_001f67cf:
          wVar6 = borg_danger(unaff_R14D,unaff_EBP,turns,true,false);
          uVar8 = (uint)(borg.trait[0x1b] < wVar6);
        }
      }
      local_50 = local_50 + uVar8;
    }
    bVar10 = local_50 <= emergency;
    pcVar11 = "# No Phase. scary squares: %d";
    if (local_50 <= emergency) {
      pcVar11 = "# Safe to Phase. scary squares: %d";
    }
    pcVar11 = format(pcVar11);
    borg_note(pcVar11);
  }
  return bVar10;
}

Assistant:

bool borg_caution_phase(int emergency, int turns)
{
    int n, k, i, d, x, y, p;

    int dis       = 10;
    int min       = dis / 2;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 1))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 1))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Skip webs */
            if (ag->web)
                continue;

            /* Stop looking */
            break;
        }

        /* If low level, unknown squares are scary */
        if (ag->feat == FEAT_NONE && borg.trait[BI_MAXHP] < 30) {
            n++;
            continue;
        }

        /* No location */
        /* in the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but may be dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine */
        p = borg_danger(y, x, turns, true, false);

        /* if *very* scary, do not allow jumps at all */
        if (p > borg.trait[BI_CURHP])
            n++;
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Phase. scary squares: %d", n));
        return false;
    } else
        borg_note(format("# Safe to Phase. scary squares: %d", n));

    /* Okay */
    return true;
}